

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastReduceMatrix2(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Int_t *vRes,int fSigned,int fCla)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  uint i;
  int iVar4;
  int Lit;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p;
  int iVar8;
  ulong uVar9;
  int NodeC;
  int NodeS;
  Gia_Man_t *local_48;
  Vec_Wec_t *local_40;
  ulong local_38;
  
  iVar3 = Wlc_BlastAddLevel(pNew,0);
  iVar1 = vProds->nSize;
  iVar4 = iVar1;
  for (iVar8 = 0; iVar8 < iVar4; iVar8 = iVar8 + 1) {
    pVVar7 = Vec_WecEntry(vProds,iVar8);
    Wlc_IntSortCostReverse(pNew,pVVar7->pArray,pVVar7->nSize);
    iVar4 = vProds->nSize;
  }
  uVar9 = 0;
  local_48 = pNew;
  local_40 = vProds;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  do {
    pGVar2 = local_48;
    if ((int)uVar9 == iVar1) {
      iVar4 = 0;
      do {
        if (iVar4 == iVar1) {
          vRes->nSize = 0;
          pVVar7 = Vec_IntAlloc(100);
          for (iVar4 = 0; iVar1 != iVar4; iVar4 = iVar4 + 1) {
            p = Vec_WecEntry(vProds,iVar4);
            iVar3 = Vec_IntEntry(p,0);
            Vec_IntPush(vRes,iVar3);
            iVar3 = Vec_IntEntry(p,1);
            Vec_IntPush(pVVar7,iVar3);
          }
          Vec_IntPush(vRes,0);
          Vec_IntPush(pVVar7,0);
          if (fCla == 0) {
            Wlc_BlastAdder(pGVar2,vRes->pArray,pVVar7->pArray,vRes->nSize,0);
          }
          else {
            Wlc_BlastAdderCLA(pGVar2,vRes->pArray,pVVar7->pArray,vRes->nSize,fSigned,0);
          }
          Vec_IntFree(pVVar7);
          return;
        }
        pVVar7 = Vec_WecEntry(vProds,iVar4);
        while (pVVar7->nSize < 2) {
          Vec_IntPush(pVVar7,0);
        }
        iVar4 = iVar4 + 1;
      } while (pVVar7->nSize == 2);
      __assert_fail("Vec_IntSize(vProd) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x3ea,
                    "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)");
    }
    i = (int)uVar9 + 1;
    local_38 = uVar9;
    while (pVVar7 = Vec_WecEntry(vProds,(int)local_38), 2 < pVVar7->nSize) {
      iVar4 = Vec_IntPop(pVVar7);
      iVar8 = Vec_IntPop(pVVar7);
      Lit = Vec_IntPop(pVVar7);
      iVar5 = Abc_Lit2Var(Lit);
      pGVar2 = local_48;
      iVar5 = Gia_ObjLevelId(local_48,iVar5);
      iVar6 = Abc_Lit2Var(iVar8);
      iVar6 = Gia_ObjLevelId(pGVar2,iVar6);
      if (iVar5 < iVar6) {
        __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                      ,0x3d7,
                      "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      iVar5 = Abc_Lit2Var(iVar8);
      iVar5 = Gia_ObjLevelId(pGVar2,iVar5);
      iVar6 = Abc_Lit2Var(iVar4);
      iVar6 = Gia_ObjLevelId(pGVar2,iVar6);
      if (iVar5 < iVar6) {
        __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                      ,0x3d8,
                      "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      Wlc_BlastFullAdder(pGVar2,iVar4,iVar8,Lit,&NodeC,&NodeS);
      iVar3 = Wlc_BlastAddLevel(pGVar2,iVar3);
      Wlc_IntInsert2(pGVar2,pVVar7,NodeS);
      vProds = local_40;
      pVVar7 = Vec_WecEntry(local_40,i);
      Wlc_IntInsert2(pGVar2,pVVar7,NodeC);
    }
    uVar9 = (ulong)i;
  } while( true );
}

Assistant:

void Wlc_BlastReduceMatrix2( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vProd, * vTemp;
    int i, NodeS, NodeC, Node1, Node2, Node3;
    int Start = Wlc_BlastAddLevel( pNew, 0 );
    int nSize = Vec_WecSize(vProds);
    Vec_WecForEachLevel( vProds, vProd, i )
        Wlc_IntSortCostReverse( pNew, Vec_IntArray(vProd), Vec_IntSize(vProd) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) );
            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1)) );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            Start = Wlc_BlastAddLevel( pNew, Start );

            Wlc_IntInsert2( pNew, vProd, NodeS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            Wlc_IntInsert2( pNew, vProd, NodeC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    Vec_IntClear( vRes );
    vTemp = Vec_IntAlloc( 100 );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,  Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vTemp, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,  0 );
    Vec_IntPush( vTemp, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), 0 );
    Vec_IntFree( vTemp );
}